

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

complex2 * __thiscall
boost::ext::di::v1_3_0::core::successful::any_type_1st::operator_cast_to_complex2
          (complex2 *__return_storage_ptr__,any_type_1st *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  int local_28 [2];
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18;
  
  (**(code **)**(undefined8 **)this)(local_28);
  _Var1._M_pi = _Stack_18._M_pi;
  __return_storage_ptr__->i = local_28[0];
  _Stack_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->c1).i1_.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_20;
  (__return_storage_ptr__->c1).i1_.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  local_20 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18);
  return __return_storage_ptr__;
}

Assistant:

operator T() {
    return static_cast<const core::injector__<TInjector>&>(injector_).create_successful_impl(aux::type<T>{});
  }